

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# usha.c
# Opt level: O0

int USHAInput(USHAContext *ctx,uint8_t *bytes,uint bytecount)

{
  uint bytecount_local;
  uint8_t *bytes_local;
  USHAContext *ctx_local;
  
  if (ctx == (USHAContext *)0x0) {
    ctx_local._4_4_ = 1;
  }
  else {
    switch(ctx->whichSha) {
    case 0:
      ctx_local._4_4_ = SHA1Input(&(ctx->ctx).sha1Context,bytes,bytecount);
      break;
    case 1:
      ctx_local._4_4_ = SHA224Input(&(ctx->ctx).sha224Context,bytes,bytecount);
      break;
    case 2:
      ctx_local._4_4_ = SHA256Input(&(ctx->ctx).sha256Context,bytes,bytecount);
      break;
    case 3:
      ctx_local._4_4_ = SHA384Input(&(ctx->ctx).sha384Context,bytes,bytecount);
      break;
    case 4:
      ctx_local._4_4_ = SHA512Input(&(ctx->ctx).sha512Context,bytes,bytecount);
      break;
    default:
      ctx_local._4_4_ = 4;
    }
  }
  return ctx_local._4_4_;
}

Assistant:

int USHAInput(USHAContext *ctx,
    const uint8_t *bytes, unsigned int bytecount)
{
    if (ctx) {
        switch (ctx->whichSha) {
        case SHA1:
            return SHA1Input((SHA1Context*)&ctx->ctx, bytes, bytecount);
        case SHA224:
            return SHA224Input((SHA224Context*)&ctx->ctx, bytes,
                bytecount);
        case SHA256:
            return SHA256Input((SHA256Context*)&ctx->ctx, bytes,
                bytecount);
        case SHA384:
            return SHA384Input((SHA384Context*)&ctx->ctx, bytes,
                bytecount);
        case SHA512:
            return SHA512Input((SHA512Context*)&ctx->ctx, bytes,
                bytecount);
        default: return shaBadParam;
        }
    }
    else {
        return shaNull;
    }
}